

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMapFileReaderTests.cpp
# Opt level: O2

int testMMapFileReaderTestsReadData(void)

{
  bool bVar1;
  string *psVar2;
  uint64_t uVar3;
  ostream *poVar4;
  SpanSize<18446744073709551615UL> in_RCX;
  char *pcVar5;
  Span<const_char,_18446744073709551615UL> data;
  MMapFileReader reader;
  AutoDeleteTempFile tempfile;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&tempfile);
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  data.m_size.m_size = in_RCX.m_size;
  data.m_ptr = (pointer)0xd;
  MILBlob::TestUtil::WriteBlobFile<char_const,18446744073709551615ul>
            ((TestUtil *)psVar2,(string *)"salut! ca va?",data);
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  MILBlob::Blob::MMapFileReader::MMapFileReader(&reader,psVar2);
  uVar3 = MILBlob::Blob::MMapFileReader::GetLength(&reader);
  if (uVar3 == 0xd) {
    bVar1 = MILBlob::Blob::MMapFileReader::IsEncrypted(&reader);
    if (!bVar1) {
      MILBlob::Blob::MMapFileReader::ReadData(&reader,0,0xe);
      poVar4 = std::operator<<((ostream *)&std::clog,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x30);
      std::operator<<(poVar4,": expected exception, but none thrown.\n");
      goto LAB_00173b3e;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x2e);
    poVar4 = std::operator<<(poVar4,": error: ");
    pcVar5 = "!(reader.IsEncrypted())";
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x2d);
    poVar4 = std::operator<<(poVar4,": error: ");
    pcVar5 = "(reader.GetLength()) == (uint64_t(13))";
  }
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar4);
LAB_00173b3e:
  MILBlob::Blob::MMapFileReader::~MMapFileReader(&reader);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&tempfile);
  return 1;
}

Assistant:

int testMMapFileReaderTestsReadData()
{
    AutoDeleteTempFile tempfile;

    std::string_view fileData("salut! ca va?");
    TestUtil::WriteBlobFile(tempfile.GetFilename(), Util::Span<const char>(fileData.data(), fileData.size()));

    MMapFileReader reader(tempfile.GetFilename());
    ML_ASSERT_EQ(reader.GetLength(), uint64_t(13));
    ML_ASSERT_NOT(reader.IsEncrypted());

    ML_ASSERT_THROWS(reader.ReadData(0, 14), std::range_error);
    ML_ASSERT_THROWS(reader.ReadData(13, 1), std::range_error);

    {
        std::string_view expected("salut");
        Util::Span<const char> expectedSpan(expected.data(), expected.size());

        auto span = reader.ReadData(0, 5);
        ML_ASSERT_SPAN_EQ(span, expected);
    }

    {
        std::string_view expected("ca va");
        Util::Span<const char> expectedSpan(expected.data(), expected.size());

        auto span = reader.ReadData(7, 5);
        ML_ASSERT_SPAN_EQ(span, expected);
    }

    {
        Util::Span<const char> expectedSpan(fileData.data(), fileData.size());

        auto span = reader.ReadData(0, reader.GetLength());
        ML_ASSERT_SPAN_EQ(span, expectedSpan);
    }

    return 0;
}